

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heritage.cc
# Opt level: O0

void __thiscall
Heritage::splitPieces
          (Heritage *this,vector<Varnode_*,_std::allocator<Varnode_*>_> *vnlist,PcodeOp *insertop,
          Address *addr,int4 size,Varnode *startvn)

{
  Varnode *this_00;
  Funcdata *this_01;
  bool bVar1;
  int4 iVar2;
  BlockGraph *this_02;
  Address *pAVar3;
  size_type sVar4;
  const_reference ppVVar5;
  PcodeOp *op;
  uintb uVar6;
  Varnode *vn_00;
  uintb local_98;
  uintb diff;
  PcodeOp *newop;
  Varnode *vn;
  uint4 i;
  _List_iterator<PcodeOp_*> local_68;
  iterator insertiter;
  BlockBasic *bl;
  uintb uStack_50;
  bool isbigendian;
  uintb baseoff;
  Address opaddress;
  Varnode *startvn_local;
  int4 size_local;
  Address *addr_local;
  PcodeOp *insertop_local;
  vector<Varnode_*,_std::allocator<Varnode_*>_> *vnlist_local;
  Heritage *this_local;
  
  opaddress.offset = (uintb)startvn;
  Address::Address((Address *)&baseoff);
  std::_List_iterator<PcodeOp_*>::_List_iterator(&local_68);
  bVar1 = Address::isBigEndian(addr);
  if (bVar1) {
    uStack_50 = Address::getOffset(addr);
    uStack_50 = uStack_50 + (long)size;
  }
  else {
    uStack_50 = Address::getOffset(addr);
  }
  if (insertop == (PcodeOp *)0x0) {
    this_02 = Funcdata::getBasicBlocks(this->fd);
    insertiter._M_node = (_List_node_base *)BlockGraph::getStartBlock(this_02);
    local_68._M_node = (_List_node_base *)BlockBasic::beginOp((BlockBasic *)insertiter._M_node);
    pAVar3 = Funcdata::getAddress(this->fd);
    Address::operator=((Address *)&baseoff,pAVar3);
  }
  else {
    insertiter._M_node = (_List_node_base *)PcodeOp::getParent(insertop);
    local_68._M_node = (_List_node_base *)PcodeOp::getBasicIter(insertop);
    std::_List_iterator<PcodeOp_*>::operator++(&local_68);
    pAVar3 = PcodeOp::getAddr(insertop);
    Address::operator=((Address *)&baseoff,pAVar3);
  }
  vn._4_4_ = 0;
  while( true ) {
    sVar4 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(vnlist);
    if (sVar4 <= vn._4_4_) break;
    ppVVar5 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[](vnlist,(ulong)vn._4_4_)
    ;
    this_00 = *ppVVar5;
    op = Funcdata::newOp(this->fd,2,(Address *)&baseoff);
    Funcdata::opSetOpcode(this->fd,op,CPUI_SUBPIECE);
    if (bVar1) {
      uVar6 = Varnode::getOffset(this_00);
      iVar2 = Varnode::getSize(this_00);
      local_98 = uStack_50 - (uVar6 + (long)iVar2);
    }
    else {
      local_98 = Varnode::getOffset(this_00);
      local_98 = local_98 - uStack_50;
    }
    Funcdata::opSetInput(this->fd,op,(Varnode *)opaddress.offset,0);
    this_01 = this->fd;
    vn_00 = Funcdata::newConstant(this->fd,4,local_98);
    Funcdata::opSetInput(this_01,op,vn_00,1);
    Funcdata::opSetOutput(this->fd,op,this_00);
    Funcdata::opInsert(this->fd,op,(BlockBasic *)insertiter._M_node,(iterator)local_68._M_node);
    vn._4_4_ = vn._4_4_ + 1;
  }
  return;
}

Assistant:

void Heritage::splitPieces(const vector<Varnode *> &vnlist,PcodeOp *insertop,
			   const Address &addr,int4 size,Varnode *startvn)

{
  Address opaddress;
  uintb baseoff;
  bool isbigendian;
  BlockBasic *bl;
  list<PcodeOp *>::iterator insertiter;

  isbigendian = addr.isBigEndian();
  if (isbigendian)
    baseoff = addr.getOffset() + size;
  else
    baseoff = addr.getOffset();
  if (insertop == (PcodeOp *)0) {
    bl = (BlockBasic *)fd->getBasicBlocks().getStartBlock();
    insertiter = bl->beginOp();
    opaddress = fd->getAddress();
  }
  else {
    bl = insertop->getParent();
    insertiter = insertop->getBasicIter();
    ++insertiter;		// Insert AFTER the write
    opaddress = insertop->getAddr();
  }

  for(uint4 i=0;i<vnlist.size();++i) {
    Varnode *vn = vnlist[i];
    PcodeOp *newop = fd->newOp(2,opaddress);
    fd->opSetOpcode(newop,CPUI_SUBPIECE);
    uintb diff;
    if (isbigendian)
      diff = baseoff - (vn->getOffset() + vn->getSize());
    else
      diff = vn->getOffset() - baseoff;
    fd->opSetInput(newop,startvn,0);
    fd->opSetInput(newop,fd->newConstant(4,diff),1);
    fd->opSetOutput(newop,vn);
    fd->opInsert(newop,bl,insertiter);
  }
}